

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String * __thiscall Bstrlib::String::findAndReplace(String *this,char *find,char *repl,int pos)

{
  int iVar1;
  size_t sVar2;
  tagbstring u;
  tagbstring t;
  
  if (find != (char *)0x0 && repl != (char *)0x0) {
    t.data = (uchar *)find;
    sVar2 = strlen(find);
    t.slen = (int)sVar2;
    t.mlen = -1;
    u.data = (uchar *)repl;
    sVar2 = strlen(repl);
    u.slen = (int)sVar2;
    u.mlen = -1;
    iVar1 = bfindreplace(&this->super_tagbstring,&t,&u,pos);
    if (iVar1 == -1) {
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x4eb,"Failure in findreplace");
    }
  }
  return this;
}

Assistant:

String & String::findAndReplace(const char * find, const char * repl, int pos)
    {
        struct tagbstring t, u;
        if (NULL == repl || NULL == find) return *this;
        cstr2tbstr(t, find);
        cstr2tbstr(u, repl);
        if (BSTR_ERR == bfindreplace(this, (bstring) &t, (bstring) &u, pos)) bstringThrow("Failure in findreplace");
        return *this;
    }